

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O0

void __thiscall
QTreeWidgetItem::insertChildren(QTreeWidgetItem *this,int index,QList<QTreeWidgetItem_*> *children)

{
  bool bVar1;
  int iVar2;
  qsizetype qVar3;
  QTreeModel *pQVar4;
  parameter_type t;
  const_reference ppQVar5;
  long i_00;
  QTreeWidgetItem *in_RDX;
  int in_ESI;
  QTreeWidgetItem *in_RDI;
  long in_FS_OFFSET;
  QTreeWidgetItem *child_1;
  int n_2;
  int c;
  QTreeWidgetItem *i;
  int n_1;
  QTreeModel *model;
  int n;
  QTreeWidgetItem *child;
  QList<QTreeWidgetItem_*> itemsToInsert;
  QStack<QTreeWidgetItem_*> stack;
  parameter_type in_stack_ffffffffffffff28;
  QTreeModel *in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  QTreeWidgetItem *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  undefined8 in_stack_ffffffffffffff78;
  QTreeWidgetItem *pQVar6;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  QTreeWidgetItem *in_stack_ffffffffffffff88;
  int local_6c;
  int local_5c;
  QList<QTreeWidgetItem_*> local_38;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (((-1 < in_ESI) &&
      (pQVar6 = in_RDI, qVar3 = QList<QTreeWidgetItem_*>::size(&in_RDI->children), in_ESI <= qVar3))
     && (bVar1 = QList<QTreeWidgetItem_*>::isEmpty((QList<QTreeWidgetItem_*> *)0x915bcf), !bVar1)) {
    if ((in_RDI->view == (QTreeWidget *)0x0) ||
       (bVar1 = QTreeView::isSortingEnabled((QTreeView *)in_stack_ffffffffffffff30), !bVar1)) {
      pQVar4 = treeModel(in_stack_ffffffffffffff40,
                         (QTreeWidget *)
                         CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      local_20 = &DAT_aaaaaaaaaaaaaaaa;
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      QStack<QTreeWidgetItem_*>::QStack((QStack<QTreeWidgetItem_*> *)0x915cb7);
      local_38.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_38.d.ptr = (QTreeWidgetItem **)&DAT_aaaaaaaaaaaaaaaa;
      local_38.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      QList<QTreeWidgetItem_*>::QList((QList<QTreeWidgetItem_*> *)0x915cf1);
      local_6c = 0;
      while( true ) {
        t = (parameter_type)(long)local_6c;
        qVar3 = QList<QTreeWidgetItem_*>::size((QList<QTreeWidgetItem_*> *)in_RDX);
        if (qVar3 <= (long)t) break;
        ppQVar5 = QList<QTreeWidgetItem_*>::at
                            ((QList<QTreeWidgetItem_*> *)in_stack_ffffffffffffff30,
                             (qsizetype)in_stack_ffffffffffffff28);
        pQVar6 = *ppQVar5;
        if ((pQVar6->view == (QTreeWidget *)0x0) && (pQVar6->par == (QTreeWidgetItem *)0x0)) {
          QList<QTreeWidgetItem_*>::append
                    ((QList<QTreeWidgetItem_*> *)0x915d76,in_stack_ffffffffffffff28);
          if ((in_RDI->view != (QTreeWidget *)0x0) && (pQVar4 != (QTreeModel *)0x0)) {
            iVar2 = childCount((QTreeWidgetItem *)0x915d97);
            if (iVar2 == 0) {
              pQVar6->view = in_RDI->view;
            }
            else {
              QStack<QTreeWidgetItem_*>::push
                        ((QStack<QTreeWidgetItem_*> *)in_stack_ffffffffffffff30,
                         (QTreeWidgetItem **)in_stack_ffffffffffffff28);
            }
          }
          if ((pQVar4 == (QTreeModel *)0x0) || (pQVar4->rootItem != in_RDI)) {
            pQVar6->par = in_RDI;
          }
          else {
            pQVar6->par = (QTreeWidgetItem *)0x0;
          }
        }
        local_6c = local_6c + 1;
      }
      bVar1 = QList<QTreeWidgetItem_*>::isEmpty((QList<QTreeWidgetItem_*> *)0x915e24);
      if (!bVar1) {
        while (bVar1 = QList<QTreeWidgetItem_*>::isEmpty((QList<QTreeWidgetItem_*> *)0x915e3b),
              ((bVar1 ^ 0xffU) & 1) != 0) {
          in_stack_ffffffffffffff88 =
               QStack<QTreeWidgetItem_*>::pop((QStack<QTreeWidgetItem_*> *)0x915e53);
          in_stack_ffffffffffffff88->view = in_RDI->view;
          iVar2 = 0;
          while( true ) {
            in_stack_ffffffffffffff40 = (QTreeWidgetItem *)(long)iVar2;
            qVar3 = QList<QTreeWidgetItem_*>::size(&in_stack_ffffffffffffff88->children);
            if (qVar3 <= (long)in_stack_ffffffffffffff40) break;
            QList<QTreeWidgetItem_*>::at
                      ((QList<QTreeWidgetItem_*> *)in_stack_ffffffffffffff30,
                       (qsizetype)in_stack_ffffffffffffff28);
            QStack<QTreeWidgetItem_*>::push
                      ((QStack<QTreeWidgetItem_*> *)in_stack_ffffffffffffff30,
                       (QTreeWidgetItem **)in_stack_ffffffffffffff28);
            iVar2 = iVar2 + 1;
          }
        }
        if (pQVar4 != (QTreeModel *)0x0) {
          in_stack_ffffffffffffff30 = pQVar4;
          QList<QTreeWidgetItem_*>::size(&local_38);
          QTreeModel::beginInsertItems
                    ((QTreeModel *)t,in_stack_ffffffffffffff40,in_ESI,in_stack_ffffffffffffff38);
          in_stack_ffffffffffffff3c = in_ESI;
        }
        iVar2 = 0;
        while( true ) {
          i_00 = (long)iVar2;
          qVar3 = QList<QTreeWidgetItem_*>::size(&local_38);
          if (qVar3 <= i_00) break;
          ppQVar5 = QList<QTreeWidgetItem_*>::at
                              ((QList<QTreeWidgetItem_*> *)in_stack_ffffffffffffff30,i_00);
          pQVar6 = *ppQVar5;
          QList<QTreeWidgetItem_*>::insert
                    ((QList<QTreeWidgetItem_*> *)
                     CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                     (qsizetype)in_stack_ffffffffffffff30,t);
          if (pQVar6->par != (QTreeWidgetItem *)0x0) {
            QTreeWidgetItemPrivate::propagateDisabled
                      ((QTreeWidgetItemPrivate *)t,in_stack_ffffffffffffff88);
          }
          QTreeWidgetItemPrivate::updateHiddenStatus
                    ((QTreeWidgetItemPrivate *)
                     CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),in_RDX,
                     SUB81((ulong)t >> 0x38,0));
          iVar2 = iVar2 + 1;
        }
        if (pQVar4 != (QTreeModel *)0x0) {
          QTreeModel::endInsertItems((QTreeModel *)0x915fd5);
        }
      }
      QList<QTreeWidgetItem_*>::~QList((QList<QTreeWidgetItem_*> *)0x915fe4);
      QStack<QTreeWidgetItem_*>::~QStack((QStack<QTreeWidgetItem_*> *)0x915ff1);
    }
    else {
      for (local_5c = 0; qVar3 = QList<QTreeWidgetItem_*>::size((QList<QTreeWidgetItem_*> *)in_RDX),
          local_5c < qVar3; local_5c = local_5c + 1) {
        QList<QTreeWidgetItem_*>::at
                  ((QList<QTreeWidgetItem_*> *)in_stack_ffffffffffffff30,
                   (qsizetype)in_stack_ffffffffffffff28);
        insertChild((QTreeWidgetItem *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)
                    ,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20),pQVar6);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTreeWidgetItem::insertChildren(int index, const QList<QTreeWidgetItem*> &children)
{
    if (index < 0 || index > this->children.size() || children.isEmpty())
        return;

    if (view && view->isSortingEnabled()) {
        for (int n = 0; n < children.size(); ++n)
            insertChild(index, children.at(n));
        return;
    }
    QTreeModel *model = treeModel();
    QStack<QTreeWidgetItem*> stack;
    QList<QTreeWidgetItem*> itemsToInsert;
    for (int n = 0; n < children.size(); ++n) {
        QTreeWidgetItem *child = children.at(n);
        if (child->view || child->par)
            continue;
        itemsToInsert.append(child);
        if (view && model) {
            if (child->childCount() == 0)
                child->view = view;
            else
                stack.push(child);
        }
        if (model && (model->rootItem == this))
            child->par = nullptr;
        else
            child->par = this;
    }
    if (!itemsToInsert.isEmpty()) {
        while (!stack.isEmpty()) {
            QTreeWidgetItem *i = stack.pop();
            i->view = view;
            for (int c = 0; c < i->children.size(); ++c)
                stack.push(i->children.at(c));
        }
        if (model) model->beginInsertItems(this, index, itemsToInsert.size());
        for (int n = 0; n < itemsToInsert.size(); ++n) {
            QTreeWidgetItem *child = itemsToInsert.at(n);
            this->children.insert(index + n, child);
            if (child->par)
                d->propagateDisabled(child);
            d->updateHiddenStatus(child, true);
        }
        if (model) model->endInsertItems();
    }
}